

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.hpp
# Opt level: O2

void __thiscall
pstore::command_line::
opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
::~opt(opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
       *this)

{
  parser<std::__cxx11::string,void>::~parser((parser<std::__cxx11::string,void> *)&this->parser_);
  std::__cxx11::string::~string((string *)&this->value_);
  option::~option(&this->super_option);
  return;
}

Assistant:

~opt () noexcept override = default;